

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O0

void __thiscall
Centaurus::Grammar<unsigned_char>::print_dfa
          (Grammar<unsigned_char> *this,wostream *os,ATNPath *path,bool optimize_flag)

{
  ATNPath *os_00;
  ATNNodeType AVar1;
  SimpleException *this_00;
  Identifier *this_01;
  wstring *graph_name;
  undefined1 local_90 [8];
  DFA<unsigned_char> dfa;
  NFA<unsigned_char> *nfa;
  allocator local_51;
  string local_50;
  ATNNode<unsigned_char> *local_30;
  ATNNode<unsigned_char> *node;
  ATNPath *pAStack_20;
  bool optimize_flag_local;
  ATNPath *path_local;
  wostream *os_local;
  Grammar<unsigned_char> *this_local;
  
  node._7_1_ = optimize_flag;
  pAStack_20 = path;
  path_local = (ATNPath *)os;
  os_local = (wostream *)this;
  local_30 = resolve(this,path);
  AVar1 = ATNNode<unsigned_char>::type(local_30);
  if (AVar1 != RegularTerminal) {
    this_00 = (SimpleException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"The specified node is not an NFA.",&local_51);
    SimpleException::SimpleException(this_00,&local_50);
    __cxa_throw(this_00,&SimpleException::typeinfo,SimpleException::~SimpleException);
  }
  dfa.super_NFABase<Centaurus::DFAState<unsigned_char>_>.m_states.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)ATNNode<unsigned_char>::get_nfa(local_30);
  DFA<unsigned_char>::DFA
            ((DFA<unsigned_char> *)local_90,
             (NFA<unsigned_char> *)
             dfa.super_NFABase<Centaurus::DFAState<unsigned_char>_>.m_states.
             super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,(bool)(node._7_1_ & 1));
  os_00 = path_local;
  this_01 = ATNPath::leaf_id(pAStack_20);
  graph_name = Identifier::str_abi_cxx11_(this_01);
  DFA<unsigned_char>::print((DFA<unsigned_char> *)local_90,(wostream *)os_00,graph_name);
  DFA<unsigned_char>::~DFA((DFA<unsigned_char> *)local_90);
  return;
}

Assistant:

virtual void print_dfa(std::wostream& os, const ATNPath& path, bool optimize_flag) const override
    {
        const ATNNode<TCHAR>& node = resolve(path);

        if (node.type() != ATNNodeType::RegularTerminal)
        {
            throw SimpleException("The specified node is not an NFA.");
        }
        else
        {
            const NFA<TCHAR>& nfa = node.get_nfa();

            DFA<TCHAR> dfa(nfa, optimize_flag);

            dfa.print(os, path.leaf_id().str());
        }
    }